

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

void __thiscall cmCTestP4::NoteOldRevision(cmCTestP4 *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  ostringstream cmCTestLog_msg;
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  GetWorkingRevision_abi_cxx11_((string *)local_190,this);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmCTestGlobalVC).OldRevision,(string *)local_190);
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"   Old revision of repository is: ",0x22);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,
                      (this->super_cmCTestGlobalVC).OldRevision._M_dataplus._M_p,
                      (this->super_cmCTestGlobalVC).OldRevision._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestP4.cxx"
               ,0x196,(char *)local_1b0,false);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev);
  return;
}

Assistant:

void cmCTestP4::NoteOldRevision()
{
  this->OldRevision = this->GetWorkingRevision();

  cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Old revision of repository is: "
             << this->OldRevision << "\n");
  this->PriorRev.Rev = this->OldRevision;
}